

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR moveto_scnode_dfs(lyxp_set *set,lysc_node *start,uint32_t start_idx,lys_module *moveto_mod,
                        char *ncname,uint32_t options)

{
  bool bVar1;
  LY_ERR LVar2;
  lysc_node *plVar3;
  lysc_node *plVar4;
  ulong uVar5;
  long lVar6;
  uint local_44;
  
  if (start != (lysc_node *)0x0) {
    plVar4 = start;
    do {
      if ((plVar4 == start) || ((plVar4->nodetype & 0x82) != 0)) {
LAB_001b4160:
        plVar3 = lysc_node_child(plVar4);
        if (plVar3 == (lysc_node *)0x0) {
          plVar3 = (lysc_node *)0x0;
        }
        else if (plVar3->nodetype == (uint16_t)((ushort)((options & 0x10) == 0) * 0x1000 + 0x1000))
        {
          plVar3 = plVar3->next;
        }
        if (plVar3 == (lysc_node *)0x0) goto LAB_001b4180;
      }
      else {
        LVar2 = moveto_scnode_check(plVar4,start,set,ncname,moveto_mod);
        if (LVar2 != LY_EINVAL) {
          if (LVar2 == LY_SUCCESS) {
            bVar1 = true;
            if ((ulong)set->used != 0) {
              lVar6 = 8;
              uVar5 = 0;
              do {
                if ((((int)start_idx < 0 || start_idx != uVar5) &&
                    (*(lysc_node **)((long)(set->val).nodes + lVar6 + -8) == plVar4)) &&
                   (*(int *)((long)&((set->val).nodes)->node + lVar6) == 3)) {
                  bVar1 = false;
                  local_44 = (uint)uVar5;
                  break;
                }
                uVar5 = uVar5 + 1;
                lVar6 = lVar6 + 0x18;
              } while (set->used != uVar5);
            }
            if (bVar1) {
              LVar2 = lyxp_set_scnode_insert_node
                                (set,plVar4,LYXP_NODE_ELEM,LYXP_AXIS_DESCENDANT,(uint32_t *)0x0);
              if (LVar2 != LY_SUCCESS) {
                return LY_EMEM;
              }
            }
            else {
              *(undefined4 *)((long)(set->val).nodes + (ulong)local_44 * 0x18 + 0xc) = 2;
              if (start_idx < local_44) goto LAB_001b4180;
            }
          }
          goto LAB_001b4160;
        }
LAB_001b4180:
        if (plVar4 == start) {
          return LY_SUCCESS;
        }
        plVar3 = plVar4->next;
      }
      if (plVar3 == (lysc_node *)0x0) {
        for (plVar4 = plVar4->parent;
            (plVar4 != start && (plVar3 = plVar4->next, plVar3 == (lysc_node *)0x0));
            plVar4 = plVar4->parent) {
        }
      }
      plVar4 = plVar3;
    } while (plVar3 != (lysc_node *)0x0);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
moveto_scnode_dfs(struct lyxp_set *set, const struct lysc_node *start, uint32_t start_idx,
        const struct lys_module *moveto_mod, const char *ncname, uint32_t options)
{
    const struct lysc_node *next, *elem;
    uint32_t idx;
    LY_ERR rc;

    /* TREE DFS */
    for (elem = next = start; elem; elem = next) {
        if ((elem == start) || (elem->nodetype & (LYS_CHOICE | LYS_CASE))) {
            /* schema-only nodes, skip root */
            goto next_iter;
        }

        rc = moveto_scnode_check(elem, start, set, ncname, moveto_mod);
        if (!rc) {
            if (lyxp_set_scnode_contains(set, elem, LYXP_NODE_ELEM, start_idx, &idx)) {
                set->val.scnodes[idx].in_ctx = LYXP_SET_SCNODE_ATOM_CTX;
                if (idx > start_idx) {
                    /* we will process it later in the set */
                    goto skip_children;
                }
            } else {
                LY_CHECK_RET(lyxp_set_scnode_insert_node(set, elem, LYXP_NODE_ELEM, LYXP_AXIS_DESCENDANT, NULL));
            }
        } else if (rc == LY_EINVAL) {
            goto skip_children;
        }

next_iter:
        /* TREE DFS NEXT ELEM */
        /* select element for the next run - children first */
        next = lysc_node_child(elem);
        if (next && (next->nodetype == LYS_INPUT) && (options & LYXP_SCNODE_OUTPUT)) {
            next = next->next;
        } else if (next && (next->nodetype == LYS_OUTPUT) && !(options & LYXP_SCNODE_OUTPUT)) {
            next = next->next;
        }
        if (!next) {
skip_children:
            /* no children, so try siblings, but only if it's not the start,
             * that is considered to be the root and it's siblings are not traversed */
            if (elem != start) {
                next = elem->next;
            } else {
                break;
            }
        }
        while (!next) {
            /* no siblings, go back through the parents */
            if (elem->parent == start) {
                /* we are done, no next element to process */
                break;
            }
            /* parent is already processed, go to its sibling */
            elem = elem->parent;
            next = elem->next;
        }
    }

    return LY_SUCCESS;
}